

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_slow.cc
# Opt level: O2

void absl::lts_20250127::random_internal::RandenSlow::Generate(void *keys_void,void *state_void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  uint128 other;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint128 w6;
  uint128 w4;
  uint128 w3;
  uint128 w2;
  uint128 w1;
  uint128 v7;
  uint128 v6;
  void *local_158;
  
  other = *state_void;
  local_158 = keys_void;
  for (lVar28 = 0; lVar28 != 0x11; lVar28 = lVar28 + 1) {
    lVar30 = 0;
    for (uVar27 = 0; uVar27 < 0x10; uVar27 = uVar27 + 4) {
      uVar9 = *(ulong *)((long)state_void + lVar30 * 2);
      uVar10 = *(ulong *)((long)state_void + lVar30 * 2 + 8);
      uVar11 = *(undefined8 *)((long)state_void + lVar30 * 2 + 0x10);
      uVar12 = *(undefined8 *)((long)local_158 + lVar30 + 8);
      uVar1 = (uint)(uVar9 >> 0x20);
      uVar31 = *(uint *)(::(anonymous_namespace)::te0 + (ulong)((uint)uVar9 & 0xff) * 4) ^
               (uint)*(undefined8 *)((long)local_158 + lVar30) ^
               *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar1 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te2 + ((uint)(uVar10 >> 0xe) & 0x3fc)) ^
               *(uint *)(::(anonymous_namespace)::te3 + (uVar10 >> 0x38) * 4);
      uVar29 = (uint)((ulong)*(undefined8 *)((long)local_158 + lVar30) >> 0x20) ^
               *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar1 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te1 + (ulong)((uint)(uVar10 >> 8) & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te2 + (ulong)((ushort)(uVar10 >> 0x30) & 0xff) * 4
                        ) ^ *(uint *)(::(anonymous_namespace)::te3 + (uVar9 >> 0x18 & 0xff) * 4);
      uVar1 = (uint)(uVar10 >> 0x20);
      uVar33 = *(uint *)(::(anonymous_namespace)::te0 + (ulong)((uint)uVar10 & 0xff) * 4) ^
               (uint)uVar12 ^
               *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar1 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te2 + ((uint)(uVar9 >> 0xe) & 0x3fc)) ^
               *(uint *)(::(anonymous_namespace)::te3 + (uVar9 >> 0x38) * 4);
      uVar32 = (uint)((ulong)uVar12 >> 0x20) ^
               *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar1 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te1 + (ulong)((uint)(uVar9 >> 8) & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te2 + (ulong)((ushort)(uVar9 >> 0x30) & 0xff) * 4)
               ^ *(uint *)(::(anonymous_namespace)::te3 + (ulong)((uint)uVar10 >> 0x18) * 4);
      uVar12 = *(undefined8 *)((long)state_void + lVar30 * 2 + 0x18);
      uVar1 = *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar33 & 0xff) * 4);
      uVar2 = *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar32 >> 8 & 0xff) * 4);
      uVar3 = *(uint *)(::(anonymous_namespace)::te2 + (uVar31 >> 0xe & 0x3fc));
      uVar4 = *(uint *)(::(anonymous_namespace)::te3 + (ulong)(uVar29 >> 0x18) * 4);
      uVar5 = *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar32 & 0xff) * 4);
      uVar6 = *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar31 >> 8 & 0xff) * 4);
      uVar7 = *(uint *)(::(anonymous_namespace)::te2 + (uVar29 >> 0xe & 0x3fc));
      uVar8 = *(uint *)(::(anonymous_namespace)::te3 + (ulong)(uVar33 >> 0x18) * 4);
      *(ulong *)((long)state_void + lVar30 * 2 + 0x10) =
           CONCAT44((uint)((ulong)uVar11 >> 0x20) ^
                    *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar29 & 0xff) * 4) ^
                    *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar33 >> 8 & 0xff) * 4) ^
                    *(uint *)(::(anonymous_namespace)::te2 + (uVar32 >> 0xe & 0x3fc)) ^
                    *(uint *)(::(anonymous_namespace)::te3 + (ulong)(uVar31 >> 0x18) * 4),
                    *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar31 & 0xff) * 4) ^
                    (uint)uVar11 ^
                    *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar29 >> 8 & 0xff) * 4) ^
                    *(uint *)(::(anonymous_namespace)::te2 + (uVar33 >> 0xe & 0x3fc)) ^
                    *(uint *)(::(anonymous_namespace)::te3 + (ulong)(uVar32 >> 0x18) * 4));
      *(ulong *)((long)state_void + lVar30 * 2 + 0x18) =
           CONCAT44((uint)((ulong)uVar12 >> 0x20) ^ uVar5 ^ uVar6 ^ uVar7 ^ uVar8,
                    uVar1 ^ (uint)uVar12 ^ uVar2 ^ uVar3 ^ uVar4);
      uVar9 = *(ulong *)((long)state_void + lVar30 * 2 + 0x20);
      uVar10 = *(ulong *)((long)state_void + lVar30 * 2 + 0x28);
      uVar11 = *(undefined8 *)((long)state_void + lVar30 * 2 + 0x30);
      uVar12 = *(undefined8 *)((long)local_158 + lVar30 + 0x10);
      uVar13 = *(undefined8 *)((long)local_158 + lVar30 + 0x18);
      uVar1 = (uint)(uVar9 >> 0x20);
      uVar31 = *(uint *)(::(anonymous_namespace)::te0 + (ulong)((uint)uVar9 & 0xff) * 4) ^
               (uint)uVar12 ^
               *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar1 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te2 + ((uint)(uVar10 >> 0xe) & 0x3fc)) ^
               *(uint *)(::(anonymous_namespace)::te3 + (uVar10 >> 0x38) * 4);
      uVar29 = (uint)((ulong)uVar12 >> 0x20) ^
               *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar1 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te1 + (ulong)((uint)(uVar10 >> 8) & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te2 + (ulong)((ushort)(uVar10 >> 0x30) & 0xff) * 4
                        ) ^ *(uint *)(::(anonymous_namespace)::te3 + (uVar9 >> 0x18 & 0xff) * 4);
      uVar1 = (uint)(uVar10 >> 0x20);
      uVar33 = *(uint *)(::(anonymous_namespace)::te0 + (ulong)((uint)uVar10 & 0xff) * 4) ^
               (uint)uVar13 ^
               *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar1 >> 8 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te2 + ((uint)(uVar9 >> 0xe) & 0x3fc)) ^
               *(uint *)(::(anonymous_namespace)::te3 + (uVar9 >> 0x38) * 4);
      uVar32 = (uint)((ulong)uVar13 >> 0x20) ^
               *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar1 & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te1 + (ulong)((uint)(uVar9 >> 8) & 0xff) * 4) ^
               *(uint *)(::(anonymous_namespace)::te2 + (ulong)((ushort)(uVar9 >> 0x30) & 0xff) * 4)
               ^ *(uint *)(::(anonymous_namespace)::te3 + (ulong)((uint)uVar10 >> 0x18) * 4);
      uVar12 = *(undefined8 *)((long)state_void + lVar30 * 2 + 0x38);
      uVar1 = *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar33 & 0xff) * 4);
      uVar2 = *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar32 >> 8 & 0xff) * 4);
      uVar3 = *(uint *)(::(anonymous_namespace)::te2 + (uVar31 >> 0xe & 0x3fc));
      uVar4 = *(uint *)(::(anonymous_namespace)::te3 + (ulong)(uVar29 >> 0x18) * 4);
      uVar5 = *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar32 & 0xff) * 4);
      uVar6 = *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar31 >> 8 & 0xff) * 4);
      uVar7 = *(uint *)(::(anonymous_namespace)::te2 + (uVar29 >> 0xe & 0x3fc));
      uVar8 = *(uint *)(::(anonymous_namespace)::te3 + (ulong)(uVar33 >> 0x18) * 4);
      *(ulong *)((long)state_void + lVar30 * 2 + 0x30) =
           CONCAT44((uint)((ulong)uVar11 >> 0x20) ^
                    *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar29 & 0xff) * 4) ^
                    *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar33 >> 8 & 0xff) * 4) ^
                    *(uint *)(::(anonymous_namespace)::te2 + (uVar32 >> 0xe & 0x3fc)) ^
                    *(uint *)(::(anonymous_namespace)::te3 + (ulong)(uVar31 >> 0x18) * 4),
                    *(uint *)(::(anonymous_namespace)::te0 + (ulong)(uVar31 & 0xff) * 4) ^
                    (uint)uVar11 ^
                    *(uint *)(::(anonymous_namespace)::te1 + (ulong)(uVar29 >> 8 & 0xff) * 4) ^
                    *(uint *)(::(anonymous_namespace)::te2 + (uVar33 >> 0xe & 0x3fc)) ^
                    *(uint *)(::(anonymous_namespace)::te3 + (ulong)(uVar32 >> 0x18) * 4));
      *(ulong *)((long)state_void + lVar30 * 2 + 0x38) =
           CONCAT44((uint)((ulong)uVar12 >> 0x20) ^ uVar5 ^ uVar6 ^ uVar7 ^ uVar8,
                    uVar1 ^ (uint)uVar12 ^ uVar2 ^ uVar3 ^ uVar4);
      lVar30 = lVar30 + 0x20;
    }
    local_158 = (void *)((long)local_158 + lVar30);
    uVar11 = *(undefined8 *)((long)state_void + 0x30);
    uVar12 = *(undefined8 *)((long)state_void + 0x38);
    uVar13 = *(undefined8 *)((long)state_void + 0x60);
    uVar14 = *(undefined8 *)((long)state_void + 0x68);
    uVar15 = *state_void;
    uVar16 = *(undefined8 *)((long)state_void + 8);
    uVar17 = *(undefined8 *)((long)state_void + 0x90);
    uVar18 = *(undefined8 *)((long)state_void + 0x98);
    uVar19 = *(undefined8 *)((long)state_void + 0xa0);
    uVar20 = *(undefined8 *)((long)state_void + 0xa8);
    uVar21 = *(undefined8 *)((long)state_void + 0x10);
    uVar22 = *(undefined8 *)((long)state_void + 0x18);
    uVar23 = *(undefined8 *)((long)state_void + 0x50);
    uVar24 = *(undefined8 *)((long)state_void + 0x58);
    uVar25 = *(undefined8 *)((long)state_void + 0xc0);
    uVar26 = *(undefined8 *)((long)state_void + 200);
    *(undefined8 *)state_void = *(undefined8 *)((long)state_void + 0x70);
    *(undefined8 *)((long)state_void + 8) = *(undefined8 *)((long)state_void + 0x78);
    *(undefined8 *)((long)state_void + 0x10) = *(undefined8 *)((long)state_void + 0x20);
    *(undefined8 *)((long)state_void + 0x18) = *(undefined8 *)((long)state_void + 0x28);
    *(undefined8 *)((long)state_void + 0x20) = *(undefined8 *)((long)state_void + 0xd0);
    *(undefined8 *)((long)state_void + 0x28) = *(undefined8 *)((long)state_void + 0xd8);
    *(undefined8 *)((long)state_void + 0x30) = *(undefined8 *)((long)state_void + 0x40);
    *(undefined8 *)((long)state_void + 0x38) = *(undefined8 *)((long)state_void + 0x48);
    *(undefined8 *)((long)state_void + 0x40) = *(undefined8 *)((long)state_void + 0xb0);
    *(undefined8 *)((long)state_void + 0x48) = *(undefined8 *)((long)state_void + 0xb8);
    *(undefined8 *)((long)state_void + 0x50) = *(undefined8 *)((long)state_void + 0x80);
    *(undefined8 *)((long)state_void + 0x58) = *(undefined8 *)((long)state_void + 0x88);
    *(undefined8 *)((long)state_void + 0x60) = uVar11;
    *(undefined8 *)((long)state_void + 0x68) = uVar12;
    *(undefined8 *)((long)state_void + 0x70) = uVar13;
    *(undefined8 *)((long)state_void + 0x78) = uVar14;
    *(undefined8 *)((long)state_void + 0x80) = *(undefined8 *)((long)state_void + 0xf0);
    *(undefined8 *)((long)state_void + 0x88) = *(undefined8 *)((long)state_void + 0xf8);
    *(undefined8 *)((long)state_void + 0x90) = uVar15;
    *(undefined8 *)((long)state_void + 0x98) = uVar16;
    *(undefined8 *)((long)state_void + 0xa0) = uVar17;
    *(undefined8 *)((long)state_void + 0xa8) = uVar18;
    *(undefined8 *)((long)state_void + 0xb0) = uVar19;
    *(undefined8 *)((long)state_void + 0xb8) = uVar20;
    *(undefined8 *)((long)state_void + 0xc0) = uVar21;
    *(undefined8 *)((long)state_void + 200) = uVar22;
    *(undefined8 *)((long)state_void + 0xd0) = *(undefined8 *)((long)state_void + 0xe0);
    *(undefined8 *)((long)state_void + 0xd8) = *(undefined8 *)((long)state_void + 0xe8);
    *(undefined8 *)((long)state_void + 0xe0) = uVar23;
    *(undefined8 *)((long)state_void + 0xe8) = uVar24;
    *(undefined8 *)((long)state_void + 0xf0) = uVar25;
    *(undefined8 *)((long)state_void + 0xf8) = uVar26;
  }
  uint128::operator^=((uint128 *)state_void,other);
  return;
}

Assistant:

void RandenSlow::Generate(const void* keys_void, void* state_void) {
  static_assert(RandenTraits::kCapacityBytes == sizeof(absl::uint128),
                "Capacity mismatch");

  auto* state = reinterpret_cast<absl::uint128*>(state_void);
  const auto* keys = reinterpret_cast<const absl::uint128*>(keys_void);

  const absl::uint128 prev_inner = state[0];

  SwapEndian(state);

  Permute(state, keys);

  SwapEndian(state);

  // Ensure backtracking resistance.
  *state ^= prev_inner;
}